

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O2

int main(void)

{
  ushort uVar1;
  Am_Object *pAVar2;
  Am_Object local_10;
  
  Am_Initialize();
  save0("amulet_test_file_0");
  load0("amulet_test_file_0");
  save1("amulet_test_file_1");
  load1("amulet_test_file_1");
  Am_Object::Create((char *)&local_10);
  uVar1 = Am_Object::Add((ushort)&local_10,(Am_Method_Wrapper *)0xb7,(ulong)save_rect.from_wrapper);
  uVar1 = Am_Object::Set(uVar1,0x66,0x32);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,0x67,0x32);
  Am_Object::operator=(&Proto_Rect,pAVar2);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Create((char *)&local_10);
  pAVar2 = (Am_Object *)
           Am_Object::Add((ushort)&local_10,(Am_Method_Wrapper *)0xb7,(ulong)save_line.from_wrapper)
  ;
  Am_Object::operator=(&Proto_Line,pAVar2);
  Am_Object::~Am_Object(&local_10);
  Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  Am_Load_Save_Context::Register_Prototype(&Am_Default_Load_Save_Context,(Am_Wrapper *)"RED");
  Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  Am_Load_Save_Context::Register_Prototype(&Am_Default_Load_Save_Context,0x10512d,(Am_Wrapper *)0x2)
  ;
  Am_Load_Save_Context::Register_Loader
            (&Am_Default_Load_Save_Context,(Am_Load_Method *)"Proto_Rect");
  Am_Load_Save_Context::Register_Loader
            (&Am_Default_Load_Save_Context,(Am_Load_Method *)"Proto_Line");
  save2("amulet_test_file_2");
  load2("amulet_test_file_2");
  load3("testloadsave");
  Am_Do_Events(false);
  Am_Cleanup();
  return 0;
}

Assistant:

int
main(void)
{
  Am_Initialize();

  save0("amulet_test_file_0");
  load0("amulet_test_file_0");

  save1("amulet_test_file_1");
  load1("amulet_test_file_1");

  Proto_Rect = Am_Rectangle.Create("my_rect")
                   .Add(Am_SAVE_OBJECT_METHOD, save_rect)
                   .Set(Am_WIDTH, 50)
                   .Set(Am_HEIGHT, 50);

  Proto_Line =
      Am_Rectangle.Create("my_line").Add(Am_SAVE_OBJECT_METHOD, save_line);

  Am_Default_Load_Save_Context.Register_Prototype("RED", Am_Red);
  Am_Default_Load_Save_Context.Register_Prototype("BLUE", 2, Am_Blue);
  Am_Default_Load_Save_Context.Register_Loader("Proto_Rect", load_rect);
  Am_Default_Load_Save_Context.Register_Loader("Proto_Line", load_line);

  save2("amulet_test_file_2");
  load2("amulet_test_file_2");

  load3("testloadsave");

  Am_Do_Events();
  Am_Cleanup();

  return 0;
}